

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.hpp
# Opt level: O1

void __thiscall
spirv_cross::CompilerGLSL::
statement<std::__cxx11::string_const&,char_const(&)[2],char_const*&,std::__cxx11::string&,char_const(&)[2],std::__cxx11::string_const&,unsigned_int,char_const(&)[3],std::__cxx11::string&,char_const(&)[3]>
          (CompilerGLSL *this,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *ts,
          char (*ts_1) [2],char **ts_2,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *ts_3,char (*ts_4) [2],
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *ts_5,uint *ts_6,
          char (*ts_7) [3],basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *ts_8,
          char (*ts_9) [3])

{
  StringStream<4096UL,_4096UL> *this_00;
  SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
  *this_01;
  bool bVar1;
  size_t len;
  uint uVar2;
  char (*ts_9_00) [3];
  string local_50;
  
  ts_9_00 = (char (*) [3])0x22d991;
  bVar1 = Compiler::is_forcing_recompilation(&this->super_Compiler);
  if (!bVar1) {
    this_01 = this->redirect_statement;
    if (this_01 ==
        (SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
         *)0x0) {
      if (this->indent != 0) {
        uVar2 = 0;
        do {
          StringStream<4096UL,_4096UL>::append(&this->buffer,"    ",4);
          uVar2 = uVar2 + 1;
        } while (uVar2 < this->indent);
      }
      this_00 = &this->buffer;
      StringStream<4096UL,_4096UL>::append(this_00,(ts->_M_dataplus)._M_p,ts->_M_string_length);
      this->statement_count = this->statement_count + 1;
      len = strlen(*ts_1);
      StringStream<4096UL,_4096UL>::append(this_00,*ts_1,len);
      this->statement_count = this->statement_count + 1;
      statement_inner<char_const*&,std::__cxx11::string&,char_const(&)[2],std::__cxx11::string_const&,unsigned_int,char_const(&)[3],std::__cxx11::string&,char_const(&)[3]>
                (this,ts_2,ts_3,ts_4,ts_5,ts_6,ts_7,ts_8,ts_9);
      local_50._M_dataplus._M_p._0_1_ = 10;
      StringStream<4096UL,_4096UL>::append(this_00,(char *)&local_50,1);
      return;
    }
    join<std::__cxx11::string_const&,char_const(&)[2],char_const*&,std::__cxx11::string&,char_const(&)[2],std::__cxx11::string_const&,unsigned_int,char_const(&)[3],std::__cxx11::string&,char_const(&)[3]>
              (&local_50,(spirv_cross *)ts,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)ts_1,
               (char (*) [2])ts_2,(char **)ts_3,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)ts_4,
               (char (*) [2])ts_5,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)ts_6,
               (uint *)ts_7,(char (*) [3])ts_8,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)ts_9,ts_9_00);
    SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
    ::push_back(this_01,&local_50);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_50._M_dataplus._M_p._1_7_,local_50._M_dataplus._M_p._0_1_) !=
        &local_50.field_2) {
      operator_delete((undefined1 *)
                      CONCAT71(local_50._M_dataplus._M_p._1_7_,local_50._M_dataplus._M_p._0_1_));
    }
  }
  this->statement_count = this->statement_count + 1;
  return;
}

Assistant:

inline void statement(Ts &&... ts)
	{
		if (is_forcing_recompilation())
		{
			// Do not bother emitting code while force_recompile is active.
			// We will compile again.
			statement_count++;
			return;
		}

		if (redirect_statement)
		{
			redirect_statement->push_back(join(std::forward<Ts>(ts)...));
			statement_count++;
		}
		else
		{
			for (uint32_t i = 0; i < indent; i++)
				buffer << "    ";
			statement_inner(std::forward<Ts>(ts)...);
			buffer << '\n';
		}
	}